

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

void __thiscall HDual::chooseRow(HDual *this)

{
  reference pvVar1;
  reference pvVar2;
  int *piVar3;
  undefined4 uVar4;
  HFactor *in_RDI;
  HVector *unaff_retaddr;
  double c_weight;
  double u_weight;
  int *in_stack_00000058;
  HDualRHS *in_stack_00000060;
  int in_stack_ffffffffffffffcc;
  HTimer *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  value_type vVar5;
  HVector *in_stack_fffffffffffffff0;
  
  if (*(int *)((long)&(in_RDI->MCvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + 4) == 0) {
    while (HDualRHS::choose_normal(in_stack_00000060,in_stack_00000058),
          *(int *)&in_RDI[1].MRstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start != -1) {
      HTimer::recordStart(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      HVector::clear(in_stack_fffffffffffffff0);
      *(undefined4 *)
       ((long)&(in_RDI->MCvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 4) = 1;
      vVar5 = *(value_type *)
               &in_RDI[1].MRstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &(in_RDI->MCvalue).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      *pvVar1 = vVar5;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &(in_RDI->MCminpivot).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)*(int *)&in_RDI[1].MRstart.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start);
      *pvVar2 = 1.0;
      *(undefined1 *)
       &(in_RDI->MRcountb4).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = 1;
      HFactor::btran(in_RDI,(HVector *)CONCAT44(vVar5,in_stack_ffffffffffffffd8),
                     (double)in_stack_ffffffffffffffd0);
      HTimer::recordFinish(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      if (in_RDI->BtotalX != 0) {
LAB_0014981e:
        piVar3 = HModel::getBaseIndex((HModel *)0x14982c);
        *(int *)((long)&in_RDI[1].MRstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + 4) =
             piVar3[*(int *)&in_RDI[1].MRstart.super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start];
        if (*(double *)
             ((in_RDI->Bindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage +
             (long)*(int *)&in_RDI[1].MRstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start * 2) <=
            (in_RDI->Bvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish
            [*(int *)&in_RDI[1].MRstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start]) {
          in_RDI[1].MRstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((in_RDI->Bvalue).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_finish
                         [*(int *)&in_RDI[1].MRstart.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start] -
                        (in_RDI->Bvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start
                        [*(int *)&in_RDI[1].MRstart.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start]);
        }
        else {
          in_RDI[1].MRstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((in_RDI->Bvalue).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_finish
                         [*(int *)&in_RDI[1].MRstart.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start] -
                        *(double *)
                         ((in_RDI->Bindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage +
                         (long)*(int *)&in_RDI[1].MRstart.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start * 2));
        }
        uVar4 = 1;
        if ((double)in_RDI[1].MRstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage < 0.0) {
          uVar4 = 0xffffffff;
        }
        *(undefined4 *)
         &in_RDI[1].MRstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = uVar4;
        (in_RDI->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((double)(in_RDI->PFstart).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish * 0.95);
        (in_RDI->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(((double)*(int *)((long)&(in_RDI->MCvalue).
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_finish + 4) *
                       0.05) / (double)*(int *)((long)&(in_RDI->dwork).
                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               + 4) +
                      (double)(in_RDI->PFstart).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
        return;
      }
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&in_RDI[1].MCspace,
                          (long)*(int *)&in_RDI[1].MRstart.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start);
      in_stack_fffffffffffffff0 = (HVector *)*pvVar2;
      in_stack_ffffffffffffffd0 = (HTimer *)HVector::norm2(unaff_retaddr);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&in_RDI[1].MCspace,
                          (long)*(int *)&in_RDI[1].MRstart.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start);
      *pvVar2 = (value_type)in_stack_ffffffffffffffd0;
      if ((double)in_stack_ffffffffffffffd0 * 0.25 <= (double)in_stack_fffffffffffffff0)
      goto LAB_0014981e;
      *(int *)((long)&(in_RDI->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 4) =
           *(int *)((long)&(in_RDI->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 4) + 1;
    }
    *(undefined4 *)
     ((long)&(in_RDI->MCvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + 4) = 3;
  }
  return;
}

Assistant:

void HDual::chooseRow() {
	if (invertHint)
		return;
	for (;;) {
		// Choose row
		dualRHS.choose_normal(&rowOut);
		if (rowOut == -1) {
			invertHint = invertHint_possiblyOptimal; // Was 1
			return;
		}

		// Verify weight
		model->timer.recordStart(HTICK_BTRAN);
		row_ep.clear();
		row_ep.count = 1;
		row_ep.index[0] = rowOut;
		row_ep.array[rowOut] = 1;
		row_ep.packFlag = true;
		factor->btran(row_ep, row_epDensity);
		model->timer.recordFinish(HTICK_BTRAN);
		if (EdWt_Mode == EdWt_Mode_DSE) {
			//For DSE compute the correct weight c_weight and use if to see how
			//accurate the updated weight is.
			double u_weight = dualRHS.workEdWt[rowOut];
			double c_weight = dualRHS.workEdWt[rowOut] = row_ep.norm2();
			//For DSE compute the correct weight c_weight and use if to see how
			//accurate the updated weight is.
#ifdef JAJH_dev
			//			double DSE_wt_er = abs((u_weight - c_weight) / max(u_weight, c_weight));
			//if (DSE_wt_er > 1e-2)
			//			  printf(
			//	 " !! JAJH RARE PRINT: Iter %d: DSE_wt_er = %8g = (%8g - %8g)/max(u_weight,c_weight)\n",
			//	 model->numberIteration, DSE_wt_er, u_weight, c_weight);
#endif
			if (u_weight >= 0.25 * c_weight)
			  break;
#ifdef JAJH_dev
			//printf(
			//       " !! JAJH RARE PRINT: Iter %d: DSE_wt_er = %8g from %8g, %8g with u_weight/c_weight = %g < 0.25\n",
			//       model->numberIteration, DSE_wt_er, u_weight, c_weight,
			//       u_weight / c_weight);
			n_wg_DSE_wt+=1;
#endif
		} else {
			//If not using DSE then accept the row by breaking out of the loop
			break;
		}
	}

	// Assign basic info
	columnOut = model->getBaseIndex()[rowOut];
	if (baseValue[rowOut] < baseLower[rowOut])
		deltaPrimal = baseValue[rowOut] - baseLower[rowOut];
	else
		deltaPrimal = baseValue[rowOut] - baseUpper[rowOut];
	sourceOut = deltaPrimal < 0 ? -1 : 1;
	row_epDensity *= 0.95;
	row_epDensity += 0.05 * row_ep.count / numRow;
}